

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O2

C_Node * new_var_node(C_Parser *parser,C_Obj *var,C_Token *tok)

{
  C_Node *pCVar1;
  
  pCVar1 = (C_Node *)(*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
  pCVar1->kind = ND_VAR;
  pCVar1->tok = tok;
  pCVar1->var = var;
  return pCVar1;
}

Assistant:

static C_Node *new_var_node(C_Parser *parser, C_Obj *var, C_Token *tok) {
  C_Node *node = new_node(parser, ND_VAR, tok);
  node->var = var;
  return node;
}